

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscalls.cpp
# Opt level: O2

external_function *
skiwi::convert_external_to_vm(external_function *__return_storage_ptr__,external_function *ext)

{
  argtype *paVar1;
  argtype aVar2;
  argtype *paVar3;
  argtype local_2c;
  
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->arguments).
  super__Vector_base<assembler::external_function::argtype,_std::allocator<assembler::external_function::argtype>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->arguments).
  super__Vector_base<assembler::external_function::argtype,_std::allocator<assembler::external_function::argtype>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->arguments).
  super__Vector_base<assembler::external_function::argtype,_std::allocator<assembler::external_function::argtype>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->address = ext->address;
  aVar2 = anon_unknown_15::convert(ext->return_type);
  __return_storage_ptr__->return_type = aVar2;
  paVar1 = (ext->arguments).
           super__Vector_base<skiwi::external_function::argtype,_std::allocator<skiwi::external_function::argtype>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (paVar3 = (ext->arguments).
                super__Vector_base<skiwi::external_function::argtype,_std::allocator<skiwi::external_function::argtype>_>
                ._M_impl.super__Vector_impl_data._M_start; paVar3 != paVar1; paVar3 = paVar3 + 1) {
    local_2c = anon_unknown_15::convert(*paVar3);
    std::
    vector<assembler::external_function::argtype,_std::allocator<assembler::external_function::argtype>_>
    ::emplace_back<assembler::external_function::argtype>
              (&__return_storage_ptr__->arguments,&local_2c);
  }
  return __return_storage_ptr__;
}

Assistant:

ASM::external_function convert_external_to_vm(const external_function& ext)
{
    ASM::external_function ef;
    ef.name = ext.name;
    ef.address = ext.address;
    ef.return_type = convert(ext.return_type);
    for (auto arg : ext.arguments)
      {
      ef.arguments.push_back(convert(arg));
      }
    return ef;
}